

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRAM.c
# Opt level: O1

void PPUADDR_update_temp_VRAM_address(uint8_t value)

{
  if (write_toggle) {
    VRAM_state_0 = (ushort)value | VRAM_state_1 & 0xff00;
    VRAM_state_1 = VRAM_state_0;
  }
  else {
    VRAM_state_1 = (ushort)(value & 0x3f) << 8 | VRAM_state_1 & 0xff;
  }
  write_toggle = !write_toggle;
  return;
}

Assistant:

void PPUADDR_update_temp_VRAM_address(uint8_t value) {
    const uint16_t clear_low_byte = 0xFF00;
    const uint16_t clear_high_byte = 0x00FF;

    if(write_toggle) {
        VRAM_state.temp_VRAM_address &= clear_low_byte;
        VRAM_state.temp_VRAM_address |= value;
        VRAM_state.VRAM_address = VRAM_state.temp_VRAM_address;
    }
    else {
        VRAM_state.temp_VRAM_address &= clear_high_byte;
        VRAM_state.temp_VRAM_address |= (value & 0x3F) << 8;
    }
    write_toggle ^= 1;
}